

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::VarDeclStmt> __thiscall
mocker::Parser::varDeclStmt(Parser *this,TokIter *iter,TokIter end)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TokenID TVar4;
  pointer pTVar5;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<mocker::ast::VarDeclStmt> sVar7;
  Position beg_00;
  Position beg_01;
  Position end_00;
  Position end_01;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_1d0;
  pair<mocker::Position,_mocker::Position> local_1c8;
  size_t local_1a8;
  shared_ptr<mocker::ast::Type> *psStack_1a0;
  TokIter *local_198;
  size_t sStack_190;
  Token *local_188;
  undefined1 local_178 [8];
  shared_ptr<mocker::ast::Expression> expr;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_150;
  pair<mocker::Position,_mocker::Position> local_148;
  size_t local_128;
  shared_ptr<mocker::ast::Type> *psStack_120;
  TokIter *local_118;
  size_t sStack_110;
  Token *local_108;
  undefined1 local_f8 [8];
  shared_ptr<mocker::ast::Identifier> ident;
  undefined1 local_e0 [8];
  shared_ptr<mocker::ast::Type> varType;
  Parser local_b0;
  Parser local_98;
  TokIter beg;
  anon_class_24_2_341b408a throwError;
  size_t local_60;
  Position begPos;
  GetTokenID local_30;
  GetTokenID id;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  id.end._M_current = (TokIter)(TokIter)end._M_current;
  GetTokenID::GetTokenID(&local_30,in_RCX);
  pTVar5 = __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)id.end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&throwError.iter,pTVar5);
  beg._M_current = (Token *)throwError.iter;
  throwError.begPos.col = (size_t)id.end._M_current;
  local_98.pos = *(unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                   **)id.end._M_current;
  type(&local_98,iter,id.end._M_current);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_98);
  bVar1 = false;
  bVar3 = true;
  if (bVar2) {
    identifier(&local_b0,iter,id.end._M_current);
    bVar1 = true;
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_b0);
    bVar3 = true;
    if (bVar2) {
      varType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)id.end._M_current,0);
      TVar4 = GetTokenID::operator()
                        (&local_30,
                         (TokIter)varType.
                                  super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
      bVar3 = TVar4 == LeftParen;
    }
  }
  if (bVar1) {
    std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)&local_b0);
  }
  std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)&local_98);
  if (bVar3) {
    *(unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
      **)id.end._M_current = local_98.pos;
    std::shared_ptr<mocker::ast::VarDeclStmt>::shared_ptr
              ((shared_ptr<mocker::ast::VarDeclStmt> *)this,(nullptr_t)0x0);
    _Var6._M_pi = extraout_RDX;
  }
  else {
    *(unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
      **)id.end._M_current = local_98.pos;
    type((Parser *)local_e0,iter,id.end._M_current);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e0);
    if (!bVar3) {
      __assert_fail("varType",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                    ,0x1bd,
                    "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                   );
    }
    identifier((Parser *)local_f8,iter,id.end._M_current);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_f8);
    if (!bVar3) {
      __assert_fail("ident",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                    ,0x1bf,
                    "std::shared_ptr<ast::VarDeclStmt> mocker::Parser::varDeclStmt(TokIter &, TokIter)"
                   );
    }
    local_108 = *(Token **)id.end._M_current;
    TVar4 = GetTokenID::operator()(&local_30,(TokIter)local_108);
    if (TVar4 == Semicolon) {
      local_118 = throwError.iter;
      sStack_110 = local_60;
      local_150 = __gnu_cxx::
                  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                *)id.end._M_current,0);
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->(&local_150);
      Token::position(&local_148,pTVar5);
      local_128 = local_148.second.line;
      psStack_120 = (shared_ptr<mocker::ast::Type> *)local_148.second.col;
      beg_00.col = (size_t)local_118;
      beg_00.line = (size_t)iter;
      end_00.col = local_148.second.line;
      end_00.line = sStack_110;
      makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,decltype(nullptr)>
                (this,beg_00,end_00,(shared_ptr<mocker::ast::Type> *)local_148.second.col,
                 (shared_ptr<mocker::ast::Identifier> *)local_e0,(void **)local_f8);
    }
    else {
      expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)id.end._M_current;
      TVar4 = GetTokenID::operator()
                        (&local_30,
                         (TokIter)expr.
                                  super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
      if (TVar4 != Assign) {
        varDeclStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)&beg);
      }
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)id.end._M_current);
      expression((Parser *)local_178,iter,id.end._M_current);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_178);
      if (!bVar3) {
        varDeclStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)&beg);
      }
      local_188 = *(Token **)id.end._M_current;
      TVar4 = GetTokenID::operator()(&local_30,(TokIter)local_188);
      if (TVar4 != Semicolon) {
        varDeclStmt::anon_class_24_2_341b408a::operator()((anon_class_24_2_341b408a *)&beg);
      }
      local_198 = throwError.iter;
      sStack_190 = local_60;
      local_1d0 = __gnu_cxx::
                  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                *)id.end._M_current,0);
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->(&local_1d0);
      Token::position(&local_1c8,pTVar5);
      local_1a8 = local_1c8.second.line;
      psStack_1a0 = (shared_ptr<mocker::ast::Type> *)local_1c8.second.col;
      beg_01.col = (size_t)local_198;
      beg_01.line = (size_t)iter;
      end_01.col = local_1c8.second.line;
      end_01.line = sStack_190;
      makeNode<mocker::ast::VarDeclStmt,std::shared_ptr<mocker::ast::Type>&,std::shared_ptr<mocker::ast::Identifier>&,std::shared_ptr<mocker::ast::Expression>&>
                (this,beg_01,end_01,(shared_ptr<mocker::ast::Type> *)local_1c8.second.col,
                 (shared_ptr<mocker::ast::Identifier> *)local_e0,
                 (shared_ptr<mocker::ast::Expression> *)local_f8);
      std::shared_ptr<mocker::ast::Expression>::~shared_ptr
                ((shared_ptr<mocker::ast::Expression> *)local_178);
    }
    std::shared_ptr<mocker::ast::Identifier>::~shared_ptr
              ((shared_ptr<mocker::ast::Identifier> *)local_f8);
    std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_e0);
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar7.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::VarDeclStmt>)
         sVar7.super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::VarDeclStmt> Parser::varDeclStmt(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end);
  auto begPos = iter->position().first;
  auto throwError = [begPos, &iter] {
    throw SyntaxError(begPos, iter->position().second);
  };

  // look ahead
  auto beg = iter;
  if (!type(iter, end) || !identifier(iter, end) ||
      id(iter++) == TokenID::LeftParen) {
    iter = beg;
    return nullptr;
  }
  iter = beg;

  auto varType = type(iter, end);
  assert(varType);
  auto ident = identifier(iter, end);
  assert(ident);
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                      varType, ident, nullptr);

  if (id(iter) != TokenID::Assign)
    throwError();
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throwError();
  if (id(iter) != TokenID::Semicolon)
    throwError();
  return makeNode<ast::VarDeclStmt>(begPos, (iter++)->position().second,
                                    varType, ident, expr);
}